

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::BranchIf::~BranchIf(BranchIf *this)

{
  BranchIf *this_local;
  
  ~BranchIf(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

BranchIf (Expression& cond, Block& trueJump, Block& falseJump)
            : condition (cond), targets { trueJump, falseJump }
        {
            SOUL_ASSERT (targets[0] != targets[1]);
        }